

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SquareMatrix.hpp
# Opt level: O2

bool __thiscall
qclab::dense::SquareMatrix<std::complex<double>_>::operator==
          (SquareMatrix<std::complex<double>_> *this,SquareMatrix<std::complex<double>_> *other)

{
  double *pdVar1;
  double *pdVar2;
  long lVar3;
  undefined *puVar4;
  long lVar5;
  long lVar6;
  undefined *puVar7;
  long lVar8;
  long lVar9;
  
  lVar3 = other->size_;
  if (lVar3 != this->size_) {
    return false;
  }
  lVar6 = 0;
  lVar8 = 0;
  if (0 < lVar3) {
    lVar8 = lVar3;
  }
  puVar7 = ((this->data_)._M_t.
            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value + 8;
  puVar4 = ((other->data_)._M_t.
            super___uniq_ptr_impl<std::complex<double>,_std::default_delete<std::complex<double>[]>_>
            ._M_t.
            super__Tuple_impl<0UL,_std::complex<double>_*,_std::default_delete<std::complex<double>[]>_>
            .super__Head_base<0UL,_std::complex<double>_*,_false>._M_head_impl)->_M_value + 8;
  do {
    if (lVar6 == lVar8) {
      return lVar3 <= lVar6;
    }
    lVar9 = 0;
    lVar5 = lVar3 + 1;
    while (lVar5 = lVar5 + -1, lVar5 != 0) {
      if (*(double *)(puVar4 + lVar9 + -8) != *(double *)(puVar7 + lVar9 + -8)) {
        return false;
      }
      if (NAN(*(double *)(puVar4 + lVar9 + -8)) || NAN(*(double *)(puVar7 + lVar9 + -8))) {
        return false;
      }
      pdVar1 = (double *)(puVar4 + lVar9);
      pdVar2 = (double *)(puVar7 + lVar9);
      lVar9 = lVar9 + 0x10;
      if (*pdVar1 != *pdVar2) {
        return false;
      }
      if (NAN(*pdVar1) || NAN(*pdVar2)) {
        return false;
      }
    }
    lVar6 = lVar6 + 1;
    puVar7 = puVar7 + lVar3 * 0x10;
    puVar4 = puVar4 + lVar3 * 0x10;
  } while( true );
}

Assistant:

inline int64_t size() const { return size_ ; }